

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  LY_ERR *pLVar5;
  lyd_node *plVar6;
  char *format_00;
  lyd_node *plVar7;
  char *pcVar8;
  lyd_node *plVar9;
  lyxml_elem *local_40;
  char *local_38;
  
  iVar2 = lyp_data_check_options(ctx,options,"lyd_parse_data_");
  if (iVar2 != 0) {
    return (lyd_node *)0x0;
  }
  if ((options & 0x20U) != 0) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    plVar6 = (lyd_node *)*plVar3;
    if (((plVar6 != (lyd_node *)0x0) && (plVar6->parent == (lyd_node *)0x0)) &&
       ((plVar6->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN))
    goto LAB_0015f88c;
    format_00 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
    goto LAB_0015fa3c;
  }
  plVar6 = (lyd_node *)0x0;
LAB_0015f88c:
  if ((options & 0x70U) == 0) {
LAB_0015f92e:
    plVar7 = (lyd_node *)0x0;
  }
  else {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar3 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar3 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar3 + 1;
    }
    plVar9 = (lyd_node *)*plVar3;
    if (plVar9 == (lyd_node *)0x0) goto LAB_0015f92e;
    plVar7 = plVar9;
    if ((short)options < 0) {
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
      ;
LAB_0015fa3c:
      pcVar8 = "lyd_parse_data_";
      goto LAB_0015fa4c;
    }
    for (; plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
      if (plVar7->parent != (lyd_node *)0x0) {
        format_00 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
        goto LAB_0015fa3c;
      }
    }
    do {
      plVar7 = plVar9;
      plVar9 = plVar7->prev;
    } while (plVar7->prev->next != (lyd_node *)0x0);
    if (((uint)options >> 0xc & 1) != 0) {
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
      ;
      local_38 = data;
      goto LAB_0015fa3c;
    }
  }
  if (((uint)options >> 0x18 & 1) == 0) {
    plVar9 = (lyd_node *)0x0;
  }
  else {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar4 + 1;
    }
    plVar9 = (lyd_node *)*puVar4;
  }
  if (ctx == (ly_ctx *)0x0 || data == (char *)0x0) {
    format_00 = "Invalid arguments (%s()).";
    pcVar8 = "lyd_parse_";
    ctx = (ly_ctx *)0x0;
    local_38 = data;
LAB_0015fa4c:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format_00,pcVar8);
    return (lyd_node *)0x0;
  }
  local_38 = data;
  pLVar5 = ly_errno_glob_address();
  *pLVar5 = LY_SUCCESS;
  if (format == LYD_LYB) {
    plVar6 = lyd_parse_lyb(ctx,local_38,options,plVar7,(char *)plVar9,(int *)0x0);
  }
  else if (format == LYD_JSON) {
    plVar6 = lyd_parse_json(ctx,local_38,options,plVar6,plVar7,(char *)plVar9);
  }
  else {
    if (format == LYD_XML) {
      local_40 = lyxml_parse_mem(ctx,local_38,(uint)(((uint)options >> 0xc & 1) == 0));
      pLVar5 = ly_errno_glob_address();
      if (*pLVar5 == LY_SUCCESS) {
        if ((options & 0x20U) == 0) {
          if (((options & 0x50U) == 0) && (plVar7 = plVar9, ((uint)options >> 0x18 & 1) == 0)) {
            plVar6 = lyd_parse_xml(ctx,&local_40,options);
          }
          else {
            plVar6 = lyd_parse_xml(ctx,&local_40,options,plVar7);
          }
        }
        else {
          plVar6 = lyd_parse_xml(ctx,&local_40,options,plVar6,plVar7);
        }
        lyxml_free_withsiblings(ctx,local_40);
        goto LAB_0015fa9d;
      }
    }
    plVar6 = (lyd_node *)0x0;
  }
LAB_0015fa9d:
  pLVar5 = ly_errno_glob_address();
  if (*pLVar5 != LY_SUCCESS) {
    lyd_free_withsiblings(plVar6);
    return (lyd_node *)0x0;
  }
  return plVar6;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;
    const char *yang_data_name = NULL;

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                return NULL;
            }

            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree, yang_data_name);
}